

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

bool slang::syntax::ModportPortSyntax::isKind(SyntaxKind kind)

{
  return (bool)(kind - ModportExplicitPort < 5 & ((byte)kind ^ 1));
}

Assistant:

bool ModportPortSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::ModportExplicitPort:
        case SyntaxKind::ModportNamedPort:
        case SyntaxKind::ModportSubroutinePort:
            return true;
        default:
            return false;
    }
}